

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

bool fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>
               (appender *out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
               locale_ref loc)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  appender aVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint size;
  uint uVar16;
  ulong size_00;
  thousands_sep_result<char> ts;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char *local_2b8;
  long local_2b0;
  char local_2a8 [16];
  char local_298;
  basic_format_specs<char> *local_290;
  char local_288 [48];
  anon_class_16_2_3f014a30 local_258;
  undefined1 local_248 [32];
  char local_228 [504];
  
  thousands_sep_impl<char>((thousands_sep_result<char> *)local_248,loc);
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_248._0_8_,(char *)(local_248._8_8_ + local_248._0_8_));
  local_298 = local_228[0];
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  cVar5 = local_298;
  if (local_298 == '\0') goto LAB_00111901;
  lVar12 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
    }
  }
  uVar3 = *(ushort *)(&DAT_0013fe70 + (uint)((int)lVar12 * 2));
  uVar4 = *(ulong *)(&DAT_0013fef0 + (ulong)uVar3 * 8);
  size = (uint)uVar3 - (uint)(value < uVar4);
  pcVar9 = local_2b8;
  uVar16 = size;
  uVar14 = size;
  if (local_2b0 == 0) {
LAB_00111771:
    uVar10 = uVar16;
    uVar6 = uVar14;
    if (pcVar9 == local_2b8 + local_2b0) goto LAB_0011177c;
  }
  else {
    uVar10 = (int)local_2b0 + size;
    lVar12 = local_2b0;
    do {
      cVar2 = *pcVar9;
      uVar6 = uVar14 - (int)cVar2;
      if ((uVar6 == 0 || (int)uVar14 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00111771;
      uVar16 = uVar16 + 1;
      pcVar9 = pcVar9 + 1;
      lVar12 = lVar12 + -1;
      uVar14 = uVar6;
    } while (lVar12 != 0);
LAB_0011177c:
    uVar10 = (int)(uVar6 - 1) / (int)(local_2b8 + local_2b0)[-1] + uVar10;
  }
  local_290 = specs;
  format_decimal<char,unsigned_long>(local_288,value,size);
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_001594c0;
  local_248._8_8_ = local_228;
  local_258.size = (uVar10 + 1) - (uint)(prefix == 0);
  size_00 = (ulong)(uint)local_258.size;
  local_248._24_8_ = 500;
  if (500 < (uint)local_258.size) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,size_00);
  }
  local_248._16_8_ = local_248._24_8_;
  if (size_00 <= (ulong)local_248._24_8_) {
    local_248._16_8_ = size_00;
  }
  pcVar9 = (char *)(local_248._8_8_ + (long)local_258.size + -1);
  if (1 < (int)size) {
    uVar13 = (ulong)size;
    iVar15 = ((uint)uVar3 - (uint)(value < uVar4)) + 1;
    iVar8 = 0;
    pcVar11 = local_2b8;
    do {
      uVar13 = uVar13 - 1;
      pcVar1 = pcVar9 + -1;
      *pcVar9 = local_288[uVar13 & 0xffffffff];
      cVar2 = *pcVar11;
      if ('\0' < cVar2) {
        iVar8 = iVar8 + 1;
        if ((cVar2 != '\x7f') && (iVar8 % (int)cVar2 == 0)) {
          if (pcVar11 + 1 != local_2b8 + local_2b0) {
            iVar8 = 0;
            pcVar11 = pcVar11 + 1;
          }
          pcVar9[-1] = local_298;
          pcVar1 = pcVar9 + -2;
        }
      }
      pcVar9 = pcVar1;
      iVar15 = iVar15 + -1;
    } while (2 < iVar15);
  }
  *pcVar9 = local_288[0];
  if (prefix != 0) {
    pcVar9[-1] = (char)prefix;
  }
  local_258.data = (char *)local_248._8_8_;
  aVar7 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>(fmt::v8::appender&,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>
                    ((appender)
                     (out->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container,
                     local_290,size_00,size_00,&local_258);
  (out->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container =
       (buffer<char> *)aVar7;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
LAB_00111901:
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  return cVar5 != '\0';
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  const auto sep_size = 1;
  auto ts = thousands_sep<Char>(loc);
  if (!ts.thousands_sep) return false;
  int num_digits = count_digits(value);
  int size = num_digits, n = num_digits;
  const std::string& groups = ts.grouping;
  std::string::const_iterator group = groups.cbegin();
  while (group != groups.cend() && n > *group && *group > 0 &&
         *group != max_value<char>()) {
    size += sep_size;
    n -= *group;
    ++group;
  }
  if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
  char digits[40];
  format_decimal(digits, value, num_digits);
  basic_memory_buffer<Char> buffer;
  if (prefix != 0) ++size;
  const auto usize = to_unsigned(size);
  buffer.resize(usize);
  basic_string_view<Char> s(&ts.thousands_sep, sep_size);
  // Index of a decimal digit with the least significant digit having index 0.
  int digit_index = 0;
  group = groups.cbegin();
  auto p = buffer.data() + size - 1;
  for (int i = num_digits - 1; i > 0; --i) {
    *p-- = static_cast<Char>(digits[i]);
    if (*group <= 0 || ++digit_index % *group != 0 ||
        *group == max_value<char>())
      continue;
    if (group + 1 != groups.cend()) {
      digit_index = 0;
      ++group;
    }
    std::uninitialized_copy(s.data(), s.data() + s.size(),
                            make_checked(p, s.size()));
    p -= s.size();
  }
  *p-- = static_cast<Char>(*digits);
  if (prefix != 0) *p = static_cast<Char>(prefix);
  auto data = buffer.data();
  out = write_padded<align::right>(
      out, specs, usize, usize, [=](reserve_iterator<OutputIt> it) {
        return copy_str<Char>(data, data + size, it);
      });
  return true;
}